

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::usage
          (CommandLine<Catch::ConfigData> *this,ostream *os,string *procName)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDX;
  ostream *in_RSI;
  CommandLine<Catch::ConfigData> *unaff_retaddr;
  ostream *in_stack_00000028;
  CommandLine<Catch::ConfigData> *in_stack_00000030;
  size_t in_stack_00000248;
  size_t in_stack_00000250;
  ostream *in_stack_00000258;
  CommandLine<Catch::ConfigData> *in_stack_00000260;
  
  validate(unaff_retaddr);
  poVar2 = std::operator<<(in_RSI,"usage:\n  ");
  poVar2 = std::operator<<(poVar2,in_RDX);
  std::operator<<(poVar2," ");
  argSynopsis(in_stack_00000030,in_stack_00000028);
  bVar1 = std::
          vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
          ::empty((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                   *)in_RSI);
  if (!bVar1) {
    std::operator<<(in_RSI," [options]\n\nwhere options are: \n");
    optUsage(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248);
  }
  std::operator<<(in_RSI,"\n");
  return;
}

Assistant:

void usage( std::ostream& os, std::string const& procName ) const {
            validate();
            os << "usage:\n  " << procName << " ";
            argSynopsis( os );
            if( !m_options.empty() ) {
                os << " [options]\n\nwhere options are: \n";
                optUsage( os, 2 );
            }
            os << "\n";
        }